

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

void __thiscall
spvtools::opt::CopyPropagateArrays::PropagateObject
          (CopyPropagateArrays *this,Instruction *var_inst,MemoryObject *source,
          Instruction *insertion_point)

{
  Op OVar1;
  Instruction *new_ptr_inst;
  IRContext *this_00;
  Instruction *new_access_chain;
  Instruction *insertion_point_local;
  MemoryObject *source_local;
  Instruction *var_inst_local;
  CopyPropagateArrays *this_local;
  
  OVar1 = opt::Instruction::opcode(var_inst);
  if (OVar1 != OpVariable) {
    __assert_fail("var_inst->opcode() == spv::Op::OpVariable && \"This function propagates variables.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0xaf,
                  "void spvtools::opt::CopyPropagateArrays::PropagateObject(Instruction *, MemoryObject *, Instruction *)"
                 );
  }
  new_ptr_inst = BuildNewAccessChain(this,insertion_point,source);
  this_00 = Pass::context((Pass *)this);
  IRContext::KillNamesAndDecorates(this_00,var_inst);
  UpdateUses(this,var_inst,new_ptr_inst);
  return;
}

Assistant:

void CopyPropagateArrays::PropagateObject(Instruction* var_inst,
                                          MemoryObject* source,
                                          Instruction* insertion_point) {
  assert(var_inst->opcode() == spv::Op::OpVariable &&
         "This function propagates variables.");

  Instruction* new_access_chain = BuildNewAccessChain(insertion_point, source);
  context()->KillNamesAndDecorates(var_inst);
  UpdateUses(var_inst, new_access_chain);
}